

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OneHotEncoder.cpp
# Opt level: O2

Result * __thiscall
CoreML::OneHotEncoder::getUseSparse(Result *__return_storage_ptr__,OneHotEncoder *this,bool *state)

{
  OneHotEncoder *pOVar1;
  
  if (state != (bool *)0x0) {
    pOVar1 = Specification::Model::mutable_onehotencoder
                       ((this->super_Model).m_spec.
                        super___shared_ptr<CoreML::Specification::Model,_(__gnu_cxx::_Lock_policy)2>
                        ._M_ptr);
    *state = pOVar1->outputsparse_;
  }
  Result::Result(__return_storage_ptr__);
  return __return_storage_ptr__;
}

Assistant:

Result OneHotEncoder::getUseSparse(bool *state) {
        if (state != nullptr) {
            auto ohe = m_spec->mutable_onehotencoder();
            *state = ohe->outputsparse();
        }
        return Result();
    }